

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshShape.cpp
# Opt level: O3

void __thiscall chrono::ChTriangleMeshShape::ChTriangleMeshShape(ChTriangleMeshShape *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChTriangleMeshConnected *__tmp;
  
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChTriangleMeshShape_00b402c0
  ;
  (this->trimesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->trimesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->wireframe = false;
  this->backface_cull = false;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name,"");
  (this->scale).m_data[0] = 1.0;
  (this->scale).m_data[1] = 1.0;
  (this->scale).m_data[2] = 1.0;
  this->fixed_connectivity = false;
  (this->modified_vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->modified_vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modified_vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b3ebb8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChTriangleMeshConnected_00b3eaa8;
  p_Var1[9]._M_use_count = 0;
  p_Var1[9]._M_weak_count = 0;
  p_Var1[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[10]._M_use_count = 0;
  p_Var1[10]._M_weak_count = 0;
  p_Var1[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0xb]._M_use_count = 0;
  p_Var1[0xb]._M_weak_count = 0;
  p_Var1[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0xc]._M_use_count = 0;
  p_Var1[0xc]._M_weak_count = 0;
  p_Var1[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[5]._M_use_count = 0;
  p_Var1[5]._M_weak_count = 0;
  p_Var1[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[6]._M_use_count = 0;
  p_Var1[6]._M_weak_count = 0;
  p_Var1[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[7]._M_use_count = 0;
  p_Var1[7]._M_weak_count = 0;
  p_Var1[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[8]._M_use_count = 0;
  p_Var1[8]._M_weak_count = 0;
  p_Var1[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0xb]._M_use_count = 0;
  p_Var1[0xb]._M_weak_count = 0;
  p_Var1[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0xc]._M_use_count = 0;
  p_Var1[0xc]._M_weak_count = 0;
  p_Var1[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0xd]._M_use_count = 0;
  p_Var1[0xd]._M_weak_count = 0;
  p_Var1[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0xe]._M_use_count = 0;
  p_Var1[0xe]._M_weak_count = 0;
  p_Var1[0xf]._vptr__Sp_counted_base = (_func_int **)(p_Var1 + 0x10);
  p_Var1[0xf]._M_use_count = 0;
  p_Var1[0xf]._M_weak_count = 0;
  *(undefined1 *)&p_Var1[0x10]._vptr__Sp_counted_base = 0;
  (this->trimesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->trimesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

ChTriangleMeshShape::ChTriangleMeshShape()
    : name(""), scale(ChVector<>(1)), wireframe(false), backface_cull(false), fixed_connectivity(false) {
    trimesh = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
}